

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void show_temp_history(CHAR_DATA *ch,CHAR_DATA *victim)

{
  CHAR_DATA *ch_00;
  char *in_RSI;
  CHAR_DATA *in_RDI;
  BUFFER *output;
  
  ch_00 = (CHAR_DATA *)new_buf();
  send_to_char((char *)output,in_RDI);
  send_to_char((char *)output,in_RDI);
  if ((*(long *)(*(long *)(in_RSI + 0xc0) + 0xb10) == 0) ||
     (**(char **)(*(long *)(in_RSI + 0xc0) + 0xb10) == '\0')) {
    send_to_char((char *)output,in_RDI);
  }
  else {
    add_buf((BUFFER *)victim,(char *)output);
    buf_string((BUFFER *)ch_00);
    page_to_char(in_RSI,ch_00);
    free_buf((BUFFER *)0x59b6ad);
  }
  return;
}

Assistant:

void show_temp_history(CHAR_DATA *ch, CHAR_DATA *victim)
{
	BUFFER *output;

	output = new_buf();
	send_to_char(victim->name, ch);
	send_to_char("'s temporary history buffer:\n\r", ch);

	if (victim->pcdata->temp_history_buffer == nullptr || victim->pcdata->temp_history_buffer[0] == '\0')
	{
		send_to_char("Temporary buffer is clear.\n\r", ch);
	}
	else
	{
		add_buf(output, victim->pcdata->temp_history_buffer);
		page_to_char(buf_string(output), ch);
		free_buf(output);
	}
}